

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void nn_sws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (type == -3 && src == -2) {
    nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.srcptr);
    nn_ws_handshake_stop((nn_ws_handshake *)&self[1].srcptr);
    *(undefined4 *)&self[1].fn = 8;
  }
  else if (*(int *)&self[1].fn != 8) {
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x362);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_ws_handshake_isidle((nn_ws_handshake *)&self[1].srcptr);
  if (iVar1 != 0) {
    nn_usock_swap_owner(*(nn_usock **)&self[1].state,(nn_fsm_owner *)&self[0x3d].stopped);
    self[1].state = 0;
    self[1].src = 0;
    *(undefined4 *)&self[0x3d].stopped.fsm = 0xffffffff;
    *(undefined8 *)&self[0x3d].stopped.src = 0;
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped(self,3);
    return;
  }
  return;
}

Assistant:

static void nn_sws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;

    sws = nn_cont (self, struct nn_sws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        /*  TODO: Consider sending a close code here? */
        nn_pipebase_stop (&sws->pipebase);
        nn_ws_handshake_stop (&sws->handshaker);
        sws->state = NN_SWS_STATE_STOPPING;
    }
    if (nn_slow (sws->state == NN_SWS_STATE_STOPPING)) {
        if (nn_ws_handshake_isidle (&sws->handshaker)) {
            nn_usock_swap_owner (sws->usock, &sws->usock_owner);
            sws->usock = NULL;
            sws->usock_owner.src = -1;
            sws->usock_owner.fsm = NULL;
            sws->state = NN_SWS_STATE_IDLE;
            nn_fsm_stopped (&sws->fsm, NN_SWS_RETURN_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state (sws->state, src, type);
}